

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

void __thiscall libtorrent::settings_pack::clear(settings_pack *this,int name)

{
  __normal_iterator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __position;
  __normal_iterator<std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  __position_00;
  __normal_iterator<std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  __position_01;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  undefined1 local_60 [4];
  int local_5c;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_60._0_2_ = (undefined2)name;
  switch((uint)name >> 0xe & 3) {
  case 0:
    local_38 = local_28;
    local_58._M_p = (pointer)&local_48;
    local_48._M_local_buf[0] = '\0';
    local_50 = 0;
    local_30 = 0;
    local_28[0] = 0;
    ::std::__cxx11::string::~string((string *)&local_38);
    __position = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>,std::pair<unsigned_short,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,std::__cxx11::string>const&,std::pair<unsigned_short,std::__cxx11::string>const&)>>
                           ((this->m_strings).
                            super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->m_strings).
                            super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_60,
                            (_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                             )0x2bf1b1);
    if ((__position._M_current !=
         (this->m_strings).
         super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((uint)(__position._M_current)->first == name)) {
      ::std::
      vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&this->m_strings,(const_iterator)__position._M_current);
    }
    ::std::__cxx11::string::~string((string *)&local_58);
    break;
  case 1:
    local_5c = 0;
    __position_00 =
         ::std::
         __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,int>*,std::vector<std::pair<unsigned_short,int>,std::allocator<std::pair<unsigned_short,int>>>>,std::pair<unsigned_short,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,int>const&,std::pair<unsigned_short,int>const&)>>
                   ((this->m_ints).
                    super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (this->m_ints).
                    super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,(pair<unsigned_short,_int> *)local_60
                    ,(_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_int>_&,_const_std::pair<unsigned_short,_int>_&)>
                      )0x2bf1bb);
    if ((__position_00._M_current !=
         (this->m_ints).
         super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((uint)(__position_00._M_current)->first == name)) {
      ::std::
      vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>::
      erase(&this->m_ints,(const_iterator)__position_00._M_current);
    }
    break;
  case 2:
    local_60[2] = false;
    __position_01 =
         ::std::
         __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,bool>*,std::vector<std::pair<unsigned_short,bool>,std::allocator<std::pair<unsigned_short,bool>>>>,std::pair<unsigned_short,bool>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,bool>const&,std::pair<unsigned_short,bool>const&)>>
                   ((this->m_bools).
                    super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (this->m_bools).
                    super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (pair<unsigned_short,_bool> *)local_60,
                    (_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_bool>_&,_const_std::pair<unsigned_short,_bool>_&)>
                     )0x2bf1c5);
    if ((__position_01._M_current !=
         (this->m_bools).
         super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((uint)(__position_01._M_current)->first == name)) {
      ::std::
      vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>::
      erase(&this->m_bools,(const_iterator)__position_01._M_current);
    }
  }
  return;
}

Assistant:

void settings_pack::clear(int const name)
	{
		switch (name & type_mask)
		{
			case string_type_base:
			{
				std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
				auto const i = std::lower_bound(m_strings.begin(), m_strings.end()
					, v, &compare_first<std::string>);
				if (i != m_strings.end() && i->first == name) m_strings.erase(i);
				break;
			}
			case int_type_base:
			{
				std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
				auto const i = std::lower_bound(m_ints.begin(), m_ints.end()
					, v, &compare_first<int>);
				if (i != m_ints.end() && i->first == name) m_ints.erase(i);
				break;
			}
			case bool_type_base:
			{
				std::pair<std::uint16_t, bool> v(aux::numeric_cast<std::uint16_t>(name), false);
				auto const i = std::lower_bound(m_bools.begin(), m_bools.end()
					, v, &compare_first<bool>);
				if (i != m_bools.end() && i->first == name) m_bools.erase(i);
				break;
			}
		}
	}